

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

void process_restart(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var5;
  boolean bVar6;
  long lVar7;
  
  pjVar2 = cinfo->entropy;
  bVar6 = (*cinfo->marker->read_restart_marker)(cinfo);
  if (bVar6 == 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x19;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (0 < cinfo->comps_in_scan) {
    lVar7 = 0;
    do {
      pjVar4 = cinfo->cur_comp_info[lVar7];
      if ((cinfo->progressive_mode == 0) || ((cinfo->Ss == 0 && (cinfo->Ah == 0)))) {
        p_Var5 = (&pjVar2[4].decode_mcu)[pjVar4->dc_tbl_no];
        *(undefined8 *)(p_Var5 + 0x30) = 0;
        *(undefined8 *)(p_Var5 + 0x38) = 0;
        *(undefined8 *)(p_Var5 + 0x20) = 0;
        *(undefined8 *)(p_Var5 + 0x28) = 0;
        *(undefined8 *)(p_Var5 + 0x10) = 0;
        *(undefined8 *)(p_Var5 + 0x18) = 0;
        *(undefined8 *)p_Var5 = 0;
        *(undefined8 *)(p_Var5 + 8) = 0;
        *(undefined4 *)((long)&pjVar2[2].start_pass + lVar7 * 4 + 4) = 0;
        *(undefined4 *)((long)&pjVar2[3].start_pass + lVar7 * 4 + 4) = 0;
      }
      if (cinfo->progressive_mode == 0) {
        iVar1 = cinfo->lim_Se;
      }
      else {
        iVar1 = cinfo->Ss;
      }
      if (iVar1 != 0) {
        memset((&pjVar2[0xc].decode_mcu)[pjVar4->ac_tbl_no],0,0x100);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < cinfo->comps_in_scan);
  }
  pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined4 *)&pjVar2[2].start_pass = 0xfffffff0;
  *(uint *)((long)&pjVar2[4].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

LOCAL(boolean)
process_restart (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->insufficient_data = FALSE;

  return TRUE;
}